

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

double * r8vec_linspace_new(int n,double a_first,double a_last)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  int local_2c;
  int i;
  double *a;
  double a_last_local;
  double a_first_local;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  if (n == 1) {
    *pdVar3 = (a_first + a_last) / 2.0;
  }
  else {
    for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
      pdVar3[local_2c] =
           ((double)((n + -1) - local_2c) * a_first + (double)local_2c * a_last) / (double)(n + -1);
    }
  }
  return pdVar3;
}

Assistant:

double *r8vec_linspace_new ( int n, double a_first, double a_last )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_LINSPACE_NEW creates a vector of linearly spaced values.
//
//  Discussion:
//
//    An R8VEC is a vector of R8's.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 March 2011
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double A_FIRST, A_LAST, the first and last entries.
//
//    Output, double R8VEC_LINSPACE_NEW[N], a vector of linearly spaced data.
//
{
  double *a;
  int i;

  a = new double[n];

  if ( n == 1 )
  {
    a[0] = ( a_first + a_last ) / 2.0;
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      a[i] = ( double( n - 1 - i ) * a_first 
             + double(         i ) * a_last ) 
             / double( n - 1     );
    }
  }
  return a;
}